

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::FeatureDescription::Clear(FeatureDescription *this)

{
  string *psVar1;
  Arena *pAVar2;
  FeatureDescription *this_local;
  
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::ClearToEmptyNoArena(&this->name_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::ClearToEmptyNoArena(&this->shortdescription_,psVar1);
  pAVar2 = GetArenaNoVirtual(this);
  if (((pAVar2 == (Arena *)0x0) && (this->type_ != (FeatureType *)0x0)) &&
     (this->type_ != (FeatureType *)0x0)) {
    (*(this->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->type_ = (FeatureType *)0x0;
  return;
}

Assistant:

void FeatureDescription::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.FeatureDescription)
  name_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  shortdescription_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (GetArenaNoVirtual() == NULL && type_ != NULL) {
    delete type_;
  }
  type_ = NULL;
}